

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyDumpTables(Vec_Str_t *vOut,Vec_Flt_t *vInd1,Vec_Flt_t *vInd2,Vec_Flt_t *vValues)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  int local_2c;
  float Entry;
  int i;
  Vec_Flt_t *vValues_local;
  Vec_Flt_t *vInd2_local;
  Vec_Flt_t *vInd1_local;
  Vec_Str_t *vOut_local;
  
  iVar1 = Vec_FltSize(vInd1);
  Vec_StrPutI_(vOut,iVar1);
  for (local_2c = 0; iVar1 = Vec_FltSize(vInd1), local_2c < iVar1; local_2c = local_2c + 1) {
    fVar4 = Vec_FltEntry(vInd1,local_2c);
    Vec_StrPutF_(vOut,fVar4);
  }
  Vec_StrPut_(vOut);
  iVar1 = Vec_FltSize(vInd2);
  Vec_StrPutI_(vOut,iVar1);
  for (local_2c = 0; iVar1 = Vec_FltSize(vInd2), local_2c < iVar1; local_2c = local_2c + 1) {
    fVar4 = Vec_FltEntry(vInd2,local_2c);
    Vec_StrPutF_(vOut,fVar4);
  }
  Vec_StrPut_(vOut);
  Vec_StrPut_(vOut);
  iVar1 = Vec_FltSize(vInd1);
  iVar2 = Vec_FltSize(vInd2);
  iVar3 = Vec_FltSize(vValues);
  if (iVar1 * iVar2 != iVar3) {
    __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x3e6,
                  "void Scl_LibertyDumpTables(Vec_Str_t *, Vec_Flt_t *, Vec_Flt_t *, Vec_Flt_t *)");
  }
  for (local_2c = 0; iVar1 = Vec_FltSize(vValues), local_2c < iVar1; local_2c = local_2c + 1) {
    fVar4 = Vec_FltEntry(vValues,local_2c);
    Vec_StrPutF_(vOut,fVar4);
    iVar1 = Vec_FltSize(vInd2);
    iVar2 = Vec_FltSize(vInd2);
    if (local_2c % iVar1 == iVar2 + -1) {
      Vec_StrPut_(vOut);
    }
  }
  Vec_StrPut_(vOut);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    Vec_StrPutF_(vOut,0.0);
  }
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    Vec_StrPutF_(vOut,0.0);
  }
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    Vec_StrPutF_(vOut,0.0);
  }
  Vec_StrPut_(vOut);
  Vec_StrPut_(vOut);
  return;
}

Assistant:

void Scl_LibertyDumpTables( Vec_Str_t * vOut, Vec_Flt_t * vInd1, Vec_Flt_t * vInd2, Vec_Flt_t * vValues )
{
    int i; float Entry;
    // write entries
    Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
    Vec_FltForEachEntry( vInd1, Entry, i )
        Vec_StrPutF_( vOut, Entry );
    Vec_StrPut_( vOut );
    // write entries
    Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
    Vec_FltForEachEntry( vInd2, Entry, i )
        Vec_StrPutF_( vOut, Entry );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    // write entries
    assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
    Vec_FltForEachEntry( vValues, Entry, i )
    {
        Vec_StrPutF_( vOut, Entry );
        if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
            Vec_StrPut_( vOut );
    }
    // dump approximations
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
}